

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O1

void __thiscall mocker::ir::Malloc::~Malloc(Malloc *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this[-1].size.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__Malloc_001f1998;
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Malloc_001f19b8;
  p_Var1 = (this->super_Definition).dest.
           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Definition_001efc00;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->super_Definition)._vptr_Definition
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  operator_delete(&this[-1].size,0x38);
  return;
}

Assistant:

Malloc(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> size)
      : IRInst(InstType::Malloc), Definition(std::move(dest)),
        size(std::move(size)) {}